

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::ParseContext::ParseMessage
          (ParseContext *this,MessageLite *msg,char *ptr)

{
  bool bVar1;
  int v1;
  int v2;
  char *failure_msg;
  LogMessage *pLVar2;
  LimitToken local_6c;
  LogMessage local_68;
  Voidify local_51;
  Nullable<const_char_*> local_50;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  undefined4 local_40;
  int old_depth;
  LimitToken local_2c;
  ParseContext *pPStack_28;
  LimitToken old;
  char *ptr_local;
  MessageLite *msg_local;
  ParseContext *this_local;
  
  pPStack_28 = (ParseContext *)ptr;
  EpsCopyInputStream::LimitToken::LimitToken(&local_2c);
  pPStack_28 = (ParseContext *)ReadSizeAndPushLimitAndDepth(this,(char *)pPStack_28,&local_2c);
  if (pPStack_28 == (ParseContext *)0x0) {
    pPStack_28 = (ParseContext *)0x0;
    this_local = (ParseContext *)0x0;
  }
  else {
    absl_log_internal_check_op_result._4_4_ = this->depth_;
    pPStack_28 = (ParseContext *)MessageLite::_InternalParse(msg,(char *)pPStack_28,this);
    if (pPStack_28 != (ParseContext *)0x0) {
      v1 = absl::lts_20250127::log_internal::GetReferenceableValue
                     (absl_log_internal_check_op_result._4_4_);
      v2 = absl::lts_20250127::log_internal::GetReferenceableValue(this->depth_);
      local_50 = absl::lts_20250127::log_internal::Check_EQImpl(v1,v2,"old_depth == depth_");
      if (local_50 != (Nullable<const_char_*>)0x0) {
        failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_50);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                   ,0x1bf,failure_msg);
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_68);
      }
      local_50 = (Nullable<const_char_*>)0x0;
    }
    this->depth_ = this->depth_ + 1;
    EpsCopyInputStream::LimitToken::LimitToken(&local_6c,&local_2c);
    bVar1 = EpsCopyInputStream::PopLimit(&this->super_EpsCopyInputStream,&local_6c);
    EpsCopyInputStream::LimitToken::~LimitToken(&local_6c);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_local = pPStack_28;
    }
    else {
      this_local = (ParseContext *)0x0;
    }
  }
  local_40 = 1;
  EpsCopyInputStream::LimitToken::~LimitToken(&local_2c);
  return (char *)this_local;
}

Assistant:

const char* ParseContext::ParseMessage(MessageLite* msg, const char* ptr) {
  LimitToken old;
  ptr = ReadSizeAndPushLimitAndDepth(ptr, &old);
  if (ptr == nullptr) return ptr;
  auto old_depth = depth_;
  ptr = msg->_InternalParse(ptr, this);
  if (ptr != nullptr) ABSL_DCHECK_EQ(old_depth, depth_);
  depth_++;
  if (!PopLimit(std::move(old))) return nullptr;
  return ptr;
}